

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin2.c
# Opt level: O3

int Gia_ManAnnotateUnrolling(Gia_Man_t *p,Abc_Cex_t *pCex,int fJustMax)

{
  uint *puVar1;
  undefined1 *puVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  uint uVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  int iVar11;
  ulong uVar12;
  Gia_Obj_t *pGVar13;
  ulong *puVar14;
  Gia_Obj_t *pGVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  Gia_Obj_t *pGVar27;
  uint uVar28;
  Gia_Obj_t *pGVar29;
  long lVar30;
  
  if (p->vTruths != (Vec_Int_t *)0x0) {
    __assert_fail("p->vTruths == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin2.c"
                  ,0x4d,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  iVar11 = ((p->nObjs >> 4) + 1) - (uint)((p->nObjs & 0xfU) == 0);
  p->nTtWords = iVar11;
  lVar30 = (long)iVar11 * ((long)pCex->iFrame + 1);
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  iVar11 = (int)lVar30;
  iVar25 = 0x10;
  if (0xe < iVar11 - 1U) {
    iVar25 = iVar11;
  }
  pVVar9->nCap = iVar25;
  if (iVar25 == 0) {
    piVar10 = (int *)0x0;
  }
  else {
    piVar10 = (int *)malloc((long)iVar25 << 2);
  }
  pVVar9->pArray = piVar10;
  pVVar9->nSize = iVar11;
  memset(piVar10,0,lVar30 * 4);
  p->vTruths = pVVar9;
  Gia_ManCleanMark0(p);
  iVar11 = pCex->nRegs;
  if (-1 < pCex->iFrame) {
    iVar25 = p->nRegs;
    iVar21 = 0;
    do {
      pVVar9 = p->vCis;
      uVar26 = (ulong)(uint)pVVar9->nSize;
      if (iVar25 < pVVar9->nSize) {
        lVar30 = 0;
        do {
          if ((int)uVar26 <= lVar30) goto LAB_005077cc;
          iVar25 = pVVar9->pArray[lVar30];
          if (((long)iVar25 < 0) || (p->nObjs <= iVar25)) goto LAB_0050776f;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          uVar23 = iVar11 + (int)lVar30;
          pGVar5 = p->pObjs + iVar25;
          uVar24 = (&pCex[1].iPo)[(int)uVar23 >> 5];
          *(ulong *)pGVar5 =
               *(ulong *)pGVar5 & 0xffffffffbfffffff |
               (ulong)((uint)((uVar24 >> (uVar23 & 0x1f) & 1) != 0) << 0x1e);
          if ((uVar24 >> (uVar23 & 0x1f) & 1) != 0) {
            pGVar29 = p->pObjs;
            if ((pGVar5 < pGVar29) || (pGVar29 + p->nObjs <= pGVar5)) goto LAB_0050778e;
            uVar24 = p->nTtWords * iVar21;
            if (((int)uVar24 < 0) || (p->vTruths->nSize <= (int)uVar24)) goto LAB_005077ad;
            iVar25 = (int)((ulong)((long)pGVar5 - (long)pGVar29) >> 2) * -0x55555555;
            puVar1 = (uint *)(p->vTruths->pArray + (ulong)uVar24 + (long)(iVar25 >> 4));
            *puVar1 = *puVar1 | 1 << ((char)iVar25 * '\x02' & 0x1fU);
          }
          lVar30 = lVar30 + 1;
          pVVar9 = p->vCis;
          uVar26 = (ulong)pVVar9->nSize;
        } while (lVar30 < (long)(uVar26 - (long)p->nRegs));
        iVar11 = iVar11 + (int)lVar30;
      }
      if (0 < p->nObjs) {
        lVar30 = 0;
        lVar22 = 0;
        do {
          pGVar5 = p->pObjs;
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          pGVar29 = (Gia_Obj_t *)(&pGVar5->field_0x0 + lVar30);
          uVar26 = *(ulong *)pGVar29;
          if (((uVar26 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar26) &&
             (uVar24 = ((uint)(uVar26 >> 0x3d) ^
                       *(uint *)((long)pGVar29 + (ulong)((uint)(uVar26 >> 0x1e) & 0x7ffffffc) * -3)
                       >> 0x1e) &
                       ((uint)(uVar26 >> 0x1d) & 7 ^
                       *(uint *)((long)pGVar29 + (ulong)(uint)((int)(uVar26 & 0x1fffffff) << 2) * -3
                                ) >> 0x1e) & 1,
             *(ulong *)(&pGVar5->field_0x0 + lVar30) =
                  uVar26 & 0xffffffff3fffffff | (ulong)(uVar24 << 0x1e), uVar24 != 0)) {
            pGVar6 = p->pObjs;
            if ((pGVar29 < pGVar6) || (pGVar6 + p->nObjs <= pGVar29)) goto LAB_0050778e;
            uVar24 = p->nTtWords * iVar21;
            if (((int)uVar24 < 0) || (p->vTruths->nSize <= (int)uVar24)) goto LAB_005077ad;
            iVar25 = (int)((ulong)((long)pGVar5 + (lVar30 - (long)pGVar6)) >> 2) * -0x55555555;
            puVar1 = (uint *)(p->vTruths->pArray + (ulong)uVar24 + (long)(iVar25 >> 4));
            *puVar1 = *puVar1 | 1 << ((char)iVar25 * '\x02' & 0x1fU);
          }
          lVar22 = lVar22 + 1;
          lVar30 = lVar30 + 0xc;
        } while (lVar22 < p->nObjs);
      }
      pVVar9 = p->vCos;
      if (0 < pVVar9->nSize) {
        lVar30 = 0;
        do {
          iVar25 = pVVar9->pArray[lVar30];
          if (((long)iVar25 < 0) || (p->nObjs <= iVar25)) goto LAB_0050776f;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar5 = p->pObjs + iVar25;
          uVar26 = *(ulong *)pGVar5;
          uVar23 = (uint)(uVar26 >> 0x1d) & 1;
          uVar24 = *(uint *)(pGVar5 + -(ulong)((uint)uVar26 & 0x1fffffff)) >> 0x1e & 1;
          *(ulong *)pGVar5 = uVar26 & 0xffffffffbfffffff | (ulong)((uVar24 ^ uVar23) << 0x1e);
          if (uVar24 != uVar23) {
            pGVar29 = p->pObjs;
            if ((pGVar5 < pGVar29) || (pGVar29 + p->nObjs <= pGVar5)) goto LAB_0050778e;
            uVar24 = p->nTtWords * iVar21;
            if (((int)uVar24 < 0) || (p->vTruths->nSize <= (int)uVar24)) goto LAB_005077ad;
            iVar25 = (int)((ulong)((long)pGVar5 - (long)pGVar29) >> 2) * -0x55555555;
            puVar1 = (uint *)(p->vTruths->pArray + (ulong)uVar24 + (long)(iVar25 >> 4));
            *puVar1 = *puVar1 | 1 << ((char)iVar25 * '\x02' & 0x1fU);
          }
          lVar30 = lVar30 + 1;
          pVVar9 = p->vCos;
        } while (lVar30 < pVVar9->nSize);
      }
      iVar19 = pCex->iFrame;
      if (iVar21 == iVar19) break;
      iVar25 = p->nRegs;
      if (0 < iVar25) {
        iVar19 = 0;
        do {
          iVar3 = p->vCos->nSize;
          uVar24 = (iVar3 - iVar25) + iVar19;
          if (((int)uVar24 < 0) || (iVar3 <= (int)uVar24)) goto LAB_005077cc;
          iVar3 = p->vCos->pArray[uVar24];
          if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_0050776f;
          pGVar5 = p->pObjs;
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          iVar4 = p->vCis->nSize;
          uVar24 = (iVar4 - iVar25) + iVar19;
          if (((int)uVar24 < 0) || (iVar4 <= (int)uVar24)) goto LAB_005077cc;
          uVar24 = p->vCis->pArray[uVar24];
          lVar30 = (long)(int)uVar24;
          if ((lVar30 < 0) || ((uint)p->nObjs <= uVar24)) goto LAB_0050776f;
          uVar24 = *(uint *)(pGVar5 + iVar3) >> 0x1e & 1;
          *(ulong *)(pGVar5 + lVar30) =
               *(ulong *)(pGVar5 + lVar30) & 0xffffffffbfffffff | (ulong)(uVar24 << 0x1e);
          if (uVar24 != 0) {
            pGVar5 = pGVar5 + lVar30;
            pGVar29 = p->pObjs;
            if ((pGVar5 < pGVar29) || (pGVar29 + p->nObjs <= pGVar5)) goto LAB_0050778e;
            uVar24 = p->nTtWords * (iVar21 + 1);
            if (((int)uVar24 < 0) || (p->vTruths->nSize <= (int)uVar24)) goto LAB_005077ad;
            iVar25 = (int)((ulong)((long)pGVar5 - (long)pGVar29) >> 2) * -0x55555555;
            puVar1 = (uint *)(p->vTruths->pArray + (ulong)uVar24 + (long)(iVar25 >> 4));
            *puVar1 = *puVar1 | 1 << ((char)iVar25 * '\x02' & 0x1fU);
          }
          iVar19 = iVar19 + 1;
          iVar25 = p->nRegs;
        } while (iVar19 < iVar25);
        iVar19 = pCex->iFrame;
      }
      bVar7 = iVar21 < iVar19;
      iVar21 = iVar21 + 1;
    } while (bVar7);
  }
  if (iVar11 != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin2.c"
                  ,99,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  uVar24 = pCex->iPo;
  iVar11 = p->vCos->nSize;
  if (iVar11 - p->nRegs <= (int)uVar24) {
LAB_00507867:
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (((int)uVar24 < 0) || (iVar11 <= (int)uVar24)) {
LAB_005077cc:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar11 = p->vCos->pArray[uVar24];
  if ((-1 < (long)iVar11) && (iVar11 < p->nObjs)) {
    uVar24 = *(uint *)(p->pObjs + iVar11);
    if ((uVar24 >> 0x1e & 1) == 0) {
      puts("Counter-example is invalid.");
    }
    Gia_ManCleanMark0(p);
    uVar23 = pCex->iPo;
    iVar11 = p->vCos->nSize;
    if (iVar11 - p->nRegs <= (int)uVar23) goto LAB_00507867;
    if (((int)uVar23 < 0) || (iVar11 <= (int)uVar23)) goto LAB_005077cc;
    iVar11 = p->vCos->pArray[uVar23];
    if ((-1 < (long)iVar11) && (iVar11 < p->nObjs)) {
      pGVar5 = p->pObjs + iVar11;
      *(ulong *)pGVar5 = *(ulong *)pGVar5 | 0x40000000;
      pGVar29 = p->pObjs;
      if ((pGVar5 < pGVar29) || (pGVar29 + p->nObjs <= pGVar5)) {
LAB_0050778e:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar23 = pCex->iFrame * p->nTtWords;
      if (((int)uVar23 < 0) || (p->vTruths->nSize <= (int)uVar23)) {
LAB_005077ad:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      iVar11 = (int)((ulong)((long)pGVar5 - (long)pGVar29) >> 2) * -0x55555555;
      puVar1 = (uint *)(p->vTruths->pArray + (ulong)uVar23 + (long)(iVar11 >> 4));
      *puVar1 = *puVar1 | 2 << ((char)iVar11 * '\x02' & 0x1fU);
      iVar11 = pCex->iFrame;
      if (iVar11 < 0) {
LAB_0050774c:
        Gia_ManCleanMark0(p);
        return uVar24 >> 0x1e & 1;
      }
      do {
        pVVar9 = p->vCos;
        if (0 < pVVar9->nSize) {
          lVar30 = 0;
          do {
            iVar25 = pVVar9->pArray[lVar30];
            if (((long)iVar25 < 0) || (p->nObjs <= iVar25)) goto LAB_0050776f;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            pGVar5 = p->pObjs + iVar25;
            uVar26 = *(ulong *)pGVar5 >> 0x1e;
            uVar12 = (ulong)((uint)*(ulong *)pGVar5 & 0x1fffffff);
            *(ulong *)(pGVar5 + -uVar12) =
                 *(ulong *)(pGVar5 + -uVar12) & 0xffffffffbfffffff |
                 (ulong)(((uint)uVar26 & 1) << 0x1e);
            if ((uVar26 & 1) != 0) {
              uVar26 = *(ulong *)pGVar5;
              *(ulong *)pGVar5 = uVar26 & 0xffffffffbfffffff;
              pGVar5 = pGVar5 + -(ulong)((uint)uVar26 & 0x1fffffff);
              pGVar29 = p->pObjs;
              if ((pGVar5 < pGVar29) || (pGVar29 + p->nObjs <= pGVar5)) goto LAB_0050778e;
              uVar23 = p->nTtWords * iVar11;
              if (((int)uVar23 < 0) || (p->vTruths->nSize <= (int)uVar23)) goto LAB_005077ad;
              iVar25 = (int)((ulong)((long)pGVar5 - (long)pGVar29) >> 2) * -0x55555555;
              puVar1 = (uint *)(p->vTruths->pArray + (ulong)uVar23 + (long)(iVar25 >> 4));
              *puVar1 = *puVar1 | 2 << ((char)iVar25 * '\x02' & 0x1fU);
            }
            lVar30 = lVar30 + 1;
            pVVar9 = p->vCos;
          } while (lVar30 < pVVar9->nSize);
        }
        uVar26 = (ulong)p->nObjs;
        if (1 < (long)uVar26) {
          lVar30 = uVar26 * 0xc;
          do {
            lVar22 = lVar30 + -0xc;
            if ((long)p->nObjs < (long)uVar26) goto LAB_0050776f;
            pGVar5 = p->pObjs;
            if (pGVar5 == (Gia_Obj_t *)0x0) break;
            uVar18 = uVar26 - 1;
            pGVar29 = (Gia_Obj_t *)(&pGVar5[-1].field_0x0 + lVar30);
            uVar12 = *(ulong *)pGVar29;
            if (((uint)uVar12 & 0xc0000000) == 0x40000000 && (uVar12 & 0x1fffffff) != 0x1fffffff) {
              *(ulong *)pGVar29 = uVar12 & 0xffffffff3fffffff;
              pGVar6 = p->pObjs;
              if ((pGVar29 < pGVar6) || (pGVar15 = pGVar6 + p->nObjs, pGVar15 <= pGVar29))
              goto LAB_0050778e;
              uVar23 = p->nTtWords * iVar11;
              if (((int)uVar23 < 0) || (p->vTruths->nSize <= (int)uVar23)) goto LAB_005077ad;
              iVar21 = (int)((ulong)((long)pGVar5 + (lVar22 - (long)pGVar6)) >> 2);
              piVar10 = p->vTruths->pArray;
              iVar25 = (int)(uVar12 & 0x1fffffff);
              pGVar27 = (Gia_Obj_t *)((long)pGVar5 + lVar22 + (ulong)(uint)(iVar25 * 4) * -3);
              if ((pGVar27 < pGVar6) || (pGVar15 <= pGVar27)) goto LAB_0050778e;
              iVar25 = (int)((long)pGVar5 +
                             lVar22 + ((ulong)(uint)(iVar25 << 2) * -3 - (long)pGVar6) >> 2);
              uVar20 = (uint)(uVar12 >> 0x20);
              uVar17 = uVar20 & 0x1fffffff;
              pGVar13 = (Gia_Obj_t *)((long)pGVar5 + lVar22 + (ulong)(uVar17 * 4) * -3);
              if ((pGVar13 < pGVar6) || (pGVar15 <= pGVar13)) goto LAB_0050778e;
              uVar8 = (uint)(uVar12 >> 0x1d) & 1;
              uVar16 = (uint)(((uint)piVar10[(ulong)uVar23 + (long)(iVar25 * -0x55555555 >> 4)] >>
                               (iVar25 * 0x55555556 & 0x1fU) & 1) != 0);
              uVar28 = uVar16 ^ uVar8;
              iVar25 = (int)((long)pGVar5 + lVar22 + ((ulong)(uVar17 << 2) * -3 - (long)pGVar6) >> 2
                            );
              uVar20 = uVar20 >> 0x1d & 1;
              uVar17 = (uint)(((uint)piVar10[(ulong)uVar23 + (long)(iVar25 * -0x55555555 >> 4)] >>
                               (iVar25 * 0x55555556 & 0x1fU) & 1) != 0);
              uVar23 = (uint)(((uint)piVar10[(ulong)uVar23 + (long)(iVar21 * -0x55555555 >> 4)] >>
                               (iVar21 * 0x55555556 & 0x1fU) & 1) != 0);
              if (uVar28 == (uVar17 ^ uVar20)) {
                if (uVar23 != uVar28) {
                  __assert_fail("Value == (Value0 & Value1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin2.c"
                                ,0x81,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)")
                  ;
                }
                if (uVar23 == 0 && fJustMax == 0) {
LAB_00507439:
                  pGVar27->field_0x3 = pGVar27->field_0x3 | 0x40;
                  uVar23 = (uint)*(undefined8 *)(&pGVar5[-1].field_0x0 + lVar30) & 0x1fffffff;
                  pGVar29 = (Gia_Obj_t *)((long)pGVar29 + (ulong)(uVar23 * 4) * -3);
                  pGVar6 = p->pObjs;
                  if ((pGVar6 <= pGVar29) && (pGVar29 < pGVar6 + p->nObjs)) {
                    uVar17 = p->nTtWords * iVar11;
                    if ((-1 < (int)uVar17) && (pVVar9 = p->vTruths, (int)uVar17 < pVVar9->nSize)) {
                      lVar30 = ((ulong)uVar23 * -0xc + uVar18 * 0xc) - (long)pGVar6;
                      goto LAB_0050754f;
                    }
                    goto LAB_005077ad;
                  }
                  goto LAB_0050778e;
                }
                pGVar13->field_0x3 = pGVar13->field_0x3 | 0x40;
                puVar14 = (ulong *)((long)pGVar29 +
                                   (ulong)((*(uint *)(&pGVar5[-1].field_0x0 + lVar30) & 0x1fffffff)
                                          << 2) * -3);
                *puVar14 = *puVar14 | 0x40000000;
                uVar23 = (uint)*(undefined8 *)(&pGVar5[-1].field_0x0 + lVar30) & 0x1fffffff;
                pGVar15 = (Gia_Obj_t *)((long)pGVar29 + (ulong)(uVar23 * 4) * -3);
                pGVar6 = p->pObjs;
                if ((pGVar15 < pGVar6) || (pGVar6 + p->nObjs <= pGVar15)) goto LAB_0050778e;
                uVar17 = p->nTtWords * iVar11;
                if (((int)uVar17 < 0) || (pVVar9 = p->vTruths, pVVar9->nSize <= (int)uVar17))
                goto LAB_005077ad;
                iVar25 = (int)((long)pGVar5 + lVar22 + ((ulong)(uVar23 << 2) * -3 - (long)pGVar6) >>
                              2) * -0x55555555;
                piVar10 = pVVar9->pArray;
                piVar10[(ulong)uVar17 + (long)(iVar25 >> 4)] =
                     piVar10[(ulong)uVar17 + (long)(iVar25 >> 4)] |
                     2 << ((char)iVar25 * '\x02' & 0x1fU);
                uVar23 = *(uint *)(&pGVar5[-1].field_0x4 + lVar30) & 0x1fffffff;
                pGVar29 = (Gia_Obj_t *)((long)pGVar29 + (ulong)(uVar23 * 4) * -3);
                if ((pGVar29 < pGVar6) || (pGVar6 + p->nObjs <= pGVar29)) goto LAB_0050778e;
                uVar17 = p->nTtWords * iVar11;
                if (((int)uVar17 < 0) || (pVVar9->nSize <= (int)uVar17)) goto LAB_005077ad;
                lVar30 = ((ulong)uVar23 * -0xc + uVar18 * 0xc) - (long)pGVar6;
              }
              else {
                if (uVar16 == uVar8) {
                  if (uVar23 != 0) {
                    __assert_fail("Value == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin2.c"
                                  ,0x90,
                                  "int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)");
                  }
                  goto LAB_00507439;
                }
                if (uVar17 != uVar20) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin2.c"
                                ,0x9a,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)")
                  ;
                }
                if (uVar23 != 0) {
                  __assert_fail("Value == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexMin2.c"
                                ,0x96,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)")
                  ;
                }
                pGVar13->field_0x3 = pGVar13->field_0x3 | 0x40;
                uVar23 = *(uint *)(&pGVar5[-1].field_0x4 + lVar30) & 0x1fffffff;
                pGVar29 = (Gia_Obj_t *)((long)pGVar29 + (ulong)(uVar23 * 4) * -3);
                pGVar6 = p->pObjs;
                if ((pGVar29 < pGVar6) || (pGVar6 + p->nObjs <= pGVar29)) goto LAB_0050778e;
                uVar17 = p->nTtWords * iVar11;
                if (((int)uVar17 < 0) || (pVVar9 = p->vTruths, pVVar9->nSize <= (int)uVar17))
                goto LAB_005077ad;
                lVar30 = lVar22 + ((ulong)(uVar23 << 2) * -3 - (long)pGVar6);
LAB_0050754f:
                piVar10 = pVVar9->pArray;
              }
              iVar25 = (int)((ulong)(&pGVar5->field_0x0 + lVar30) >> 2) * -0x55555555;
              piVar10[(ulong)uVar17 + (long)(iVar25 >> 4)] =
                   piVar10[(ulong)uVar17 + (long)(iVar25 >> 4)] |
                   2 << ((char)iVar25 * '\x02' & 0x1fU);
            }
            bVar7 = 2 < uVar26;
            uVar26 = uVar18;
            lVar30 = lVar22;
          } while (bVar7);
        }
        if (iVar11 == 0) goto LAB_0050774c;
        iVar25 = p->nRegs;
        pVVar9 = p->vCis;
        iVar21 = pVVar9->nSize;
        if (iVar25 < iVar21) {
          lVar30 = 0;
          do {
            if (iVar21 <= lVar30) goto LAB_005077cc;
            iVar21 = pVVar9->pArray[lVar30];
            if (((long)iVar21 < 0) || (p->nObjs <= iVar21)) goto LAB_0050776f;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            puVar2 = &p->pObjs[iVar21].field_0x3;
            *puVar2 = *puVar2 & 0xbf;
            lVar30 = lVar30 + 1;
            iVar25 = p->nRegs;
            pVVar9 = p->vCis;
            iVar21 = pVVar9->nSize;
          } while (lVar30 < iVar21 - iVar25);
        }
        iVar11 = iVar11 + -1;
        if (0 < iVar25) {
          iVar21 = 0;
          do {
            iVar19 = p->vCos->nSize;
            uVar23 = (iVar19 - iVar25) + iVar21;
            if (((int)uVar23 < 0) || (iVar19 <= (int)uVar23)) goto LAB_005077cc;
            iVar19 = p->vCos->pArray[uVar23];
            if (((long)iVar19 < 0) || (p->nObjs <= iVar19)) goto LAB_0050776f;
            pGVar29 = p->pObjs;
            pGVar5 = pGVar29 + iVar19;
            if (pGVar29 == (Gia_Obj_t *)0x0) break;
            iVar19 = p->vCis->nSize;
            uVar23 = (iVar19 - iVar25) + iVar21;
            if (((int)uVar23 < 0) || (iVar19 <= (int)uVar23)) goto LAB_005077cc;
            uVar23 = p->vCis->pArray[uVar23];
            lVar30 = (long)(int)uVar23;
            if ((lVar30 < 0) || ((uint)p->nObjs <= uVar23)) goto LAB_0050776f;
            uVar23 = *(uint *)(pGVar29 + lVar30) >> 0x1e & 1;
            *(ulong *)pGVar5 = *(ulong *)pGVar5 & 0xffffffffbfffffff | (ulong)(uVar23 << 0x1e);
            if (uVar23 != 0) {
              pGVar29[lVar30].field_0x3 = pGVar29[lVar30].field_0x3 & 0xbf;
              pGVar29 = p->pObjs;
              if ((pGVar5 < pGVar29) || (pGVar29 + p->nObjs <= pGVar5)) goto LAB_0050778e;
              uVar23 = p->nTtWords * iVar11;
              if (((int)uVar23 < 0) || (p->vTruths->nSize <= (int)uVar23)) goto LAB_005077ad;
              iVar25 = (int)((ulong)((long)pGVar5 - (long)pGVar29) >> 2) * -0x55555555;
              puVar1 = (uint *)(p->vTruths->pArray + (ulong)uVar23 + (long)(iVar25 >> 4));
              *puVar1 = *puVar1 | 2 << ((char)iVar25 * '\x02' & 0x1fU);
            }
            iVar21 = iVar21 + 1;
            iVar25 = p->nRegs;
          } while (iVar21 < iVar25);
        }
      } while( true );
    }
  }
LAB_0050776f:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

int Gia_ManAnnotateUnrolling( Gia_Man_t * p, Abc_Cex_t * pCex, int fJustMax )
{
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, f, k, Value, Value0, Value1, iBit;
    // start storage for internal info
    assert( p->vTruths == NULL );
    p->nTtWords = Abc_BitWordNum( 2 * Gia_ManObjNum(p) );
    p->vTruths  = Vec_IntStart( (pCex->iFrame + 1) * p->nTtWords );
    // assign values to all objects (const0 and RO in frame0 are assigned 0)
    Gia_ManCleanMark0(p);
    for ( f = 0, iBit = pCex->nRegs; f <= pCex->iFrame; f++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            if ( (pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++)) )
                Gia_ManAddTwo( p, f, pObj, 1 );
        Gia_ManForEachAnd( p, pObj, k )
            if ( (pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj))) )
                Gia_ManAddTwo( p, f, pObj, 1 );
        Gia_ManForEachCo( p, pObj, k )
            if ( (pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) )
                Gia_ManAddTwo( p, f, pObj, 1 );
        if ( f == pCex->iFrame )
            break;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            if ( (pObjRo->fMark0 = pObjRi->fMark0) )
                Gia_ManAddTwo( p, f+1, pObjRo, 1 );
    }
    assert( iBit == pCex->nBits );
    // check the output value
    RetValue = Gia_ManPo(p, pCex->iPo)->fMark0;
    if ( RetValue != 1 )
        printf( "Counter-example is invalid.\n" );
    // assign justification to nodes
    Gia_ManCleanMark0(p);
    pObj = Gia_ManPo(p, pCex->iPo);
    pObj->fMark0 = 1;
    Gia_ManAddTwo( p, pCex->iFrame, pObj, 2 );
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        // transfer to CO drivers
        Gia_ManForEachCo( p, pObj, k )
            if ( (Gia_ObjFanin0(pObj)->fMark0 = pObj->fMark0) )
            {
                pObj->fMark0 = 0;
                Gia_ManAddTwo( p, f, Gia_ObjFanin0(pObj), 2 );
            }
        // compute justification
        Gia_ManForEachAndReverse( p, pObj, k )
        {
            if ( !pObj->fMark0 ) 
                continue;
            pObj->fMark0 = 0;
            Value = (1 & Gia_ManGetTwo(p, f, pObj));
            Value0 = (1 & Gia_ManGetTwo(p, f, Gia_ObjFanin0(pObj))) ^ Gia_ObjFaninC0(pObj);
            Value1 = (1 & Gia_ManGetTwo(p, f, Gia_ObjFanin1(pObj))) ^ Gia_ObjFaninC1(pObj);
            if ( Value0 == Value1 )
            {
                assert( Value == (Value0 & Value1) );
                if ( fJustMax || Value == 1 )
                {
                    Gia_ObjFanin0(pObj)->fMark0 = Gia_ObjFanin1(pObj)->fMark0 = 1;
                    Gia_ManAddTwo( p, f, Gia_ObjFanin0(pObj), 2 );
                    Gia_ManAddTwo( p, f, Gia_ObjFanin1(pObj), 2 );
                }
                else
                {
                    Gia_ObjFanin0(pObj)->fMark0 = 1;
                    Gia_ManAddTwo( p, f, Gia_ObjFanin0(pObj), 2 );
                }
            }
            else if ( Value0 == 0 )
            {
                assert( Value == 0 );
                Gia_ObjFanin0(pObj)->fMark0 = 1;
                Gia_ManAddTwo( p, f, Gia_ObjFanin0(pObj), 2 );
            }
            else if ( Value1 == 0 )
            {
                assert( Value == 0 );
                Gia_ObjFanin1(pObj)->fMark0 = 1;
                Gia_ManAddTwo( p, f, Gia_ObjFanin1(pObj), 2 );
            }
            else assert( 0 );
        }
        if ( f == 0 )
            break;
        // transfer to RIs
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = 0;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            if ( (pObjRi->fMark0 = pObjRo->fMark0) )
            {
                pObjRo->fMark0 = 0;
                Gia_ManAddTwo( p, f-1, pObjRi, 2 );
            }
    }
    Gia_ManCleanMark0(p);
    return RetValue;
}